

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proposal.cpp
# Opt level: O1

int __thiscall ncnn::Proposal::load_param(Proposal *this,ParamDict *pd)

{
  Mat *pMVar1;
  uint uVar2;
  int *piVar3;
  Allocator *pAVar4;
  Proposal *pPVar5;
  int iVar6;
  void *pvVar7;
  float *pfVar8;
  ulong uVar9;
  int iVar10;
  float *pfVar11;
  ulong uVar12;
  long lVar13;
  ulong uVar14;
  size_t sVar15;
  long lVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  undefined1 auVar20 [16];
  undefined1 extraout_var [12];
  Mat anchors;
  float *local_b8;
  float *pfStack_b0;
  size_t local_a8;
  Allocator *pAStack_a0;
  undefined8 local_98;
  undefined8 uStack_90;
  size_t local_88;
  float local_80;
  float local_7c;
  Proposal *local_78;
  ulong local_70;
  ulong local_68;
  void *local_60;
  float local_58;
  float fStack_54;
  float fStack_50;
  float fStack_4c;
  float local_48;
  float fStack_44;
  float fStack_40;
  float fStack_3c;
  
  iVar6 = ParamDict::get(pd,0,0x10);
  this->feat_stride = iVar6;
  iVar6 = ParamDict::get(pd,1,0x10);
  this->base_size = iVar6;
  iVar6 = ParamDict::get(pd,2,6000);
  this->pre_nms_topN = iVar6;
  iVar6 = ParamDict::get(pd,3,300);
  this->after_nms_topN = iVar6;
  fVar17 = ParamDict::get(pd,4,0.7);
  this->nms_thresh = fVar17;
  iVar6 = ParamDict::get(pd,5,0x10);
  this->min_size = iVar6;
  iVar6 = this->base_size;
  uVar2 = (this->ratios).w;
  local_68 = (ulong)uVar2;
  iVar10 = (this->scales).w;
  local_70 = (ulong)iVar10;
  iVar10 = iVar10 * uVar2;
  local_b8 = (float *)0x0;
  pfStack_b0 = (float *)0x0;
  local_a8 = 4;
  pAStack_a0 = (Allocator *)0x0;
  local_98 = 0x400000002;
  uStack_90 = CONCAT44(1,iVar10);
  sVar15 = (size_t)(iVar10 * 4);
  local_88 = sVar15;
  if (iVar10 != 0) {
    pvVar7 = malloc(sVar15 * 4 + 0x1c);
    local_b8 = (float *)((long)pvVar7 + 0x17U & 0xfffffffffffffff0);
    *(void **)(local_b8 + -2) = pvVar7;
    pfStack_b0 = local_b8 + sVar15;
    *pfStack_b0 = 1.4013e-45;
  }
  local_78 = this;
  if (0 < (int)local_68) {
    local_80 = (float)iVar6;
    uVar14 = local_70 & 0xffffffff;
    local_58 = local_80 * 0.5;
    local_60 = (this->ratios).data;
    pvVar7 = (this->scales).data;
    lVar16 = (long)local_98._4_4_;
    lVar13 = local_70 * lVar16;
    uVar12 = 0;
    pfVar11 = local_b8;
    fStack_54 = local_58;
    fStack_50 = local_58;
    fStack_4c = local_58;
    do {
      if (0 < (int)local_70) {
        local_7c = *(float *)((long)local_60 + uVar12 * 4);
        auVar20 = rsqrtss(ZEXT816(0),ZEXT416((uint)local_7c));
        fVar17 = auVar20._0_4_;
        fVar17 = roundf(fVar17 * -0.5 * local_80 * (local_7c * fVar17 * fVar17 + -3.0));
        local_48 = (float)(int)fVar17;
        fStack_44 = (float)(int)extraout_var._0_4_;
        fStack_40 = (float)(int)extraout_var._4_4_;
        fStack_3c = (float)(int)extraout_var._8_4_;
        fVar17 = roundf(local_7c * local_48);
        uVar9 = 0;
        pfVar8 = pfVar11;
        do {
          fVar18 = *(float *)((long)pvVar7 + uVar9 * 4) * 0.5;
          fVar19 = fVar18 * local_48;
          fVar18 = fVar18 * (float)(int)fVar17;
          *pfVar8 = local_58 - fVar19;
          pfVar8[1] = fStack_54 - fVar18;
          pfVar8[2] = fVar19 + fStack_50;
          pfVar8[3] = fVar18 + fStack_4c;
          uVar9 = uVar9 + 1;
          pfVar8 = pfVar8 + lVar16;
        } while (uVar14 != uVar9);
      }
      uVar12 = uVar12 + 1;
      pfVar11 = pfVar11 + lVar13;
    } while (uVar12 != local_68);
  }
  pPVar5 = local_78;
  pMVar1 = &local_78->anchors;
  if (pMVar1 != (Mat *)&local_b8) {
    if (pfStack_b0 != (float *)0x0) {
      LOCK();
      *pfStack_b0 = (float)((int)*pfStack_b0 + 1);
      UNLOCK();
    }
    piVar3 = (local_78->anchors).refcount;
    if (piVar3 != (int *)0x0) {
      LOCK();
      *piVar3 = *piVar3 + -1;
      UNLOCK();
      if (*piVar3 == 0) {
        pvVar7 = (local_78->anchors).data;
        pAVar4 = (local_78->anchors).allocator;
        if (pAVar4 == (Allocator *)0x0) {
          if (pvVar7 != (void *)0x0) {
            free(*(void **)((long)pvVar7 + -8));
          }
        }
        else {
          (**(code **)(*(long *)pAVar4 + 8))();
        }
      }
    }
    pMVar1->data = (void *)0x0;
    (pPVar5->anchors).refcount = (int *)0x0;
    (pPVar5->anchors).elemsize = 0;
    (pPVar5->anchors).cstep = 0;
    (pPVar5->anchors).dims = 0;
    (pPVar5->anchors).w = 0;
    (pPVar5->anchors).h = 0;
    (pPVar5->anchors).c = 0;
    (pPVar5->anchors).data = local_b8;
    (pPVar5->anchors).refcount = (int *)pfStack_b0;
    (pPVar5->anchors).elemsize = local_a8;
    (pPVar5->anchors).allocator = pAStack_a0;
    (pPVar5->anchors).dims = (undefined4)local_98;
    (pPVar5->anchors).w = local_98._4_4_;
    (pPVar5->anchors).h = (undefined4)uStack_90;
    (pPVar5->anchors).c = uStack_90._4_4_;
    (pPVar5->anchors).cstep = local_88;
  }
  if (pfStack_b0 != (float *)0x0) {
    LOCK();
    *pfStack_b0 = (float)((int)*pfStack_b0 + -1);
    UNLOCK();
    if (*pfStack_b0 == 0.0) {
      if (pAStack_a0 == (Allocator *)0x0) {
        if (local_b8 != (float *)0x0) {
          free(*(void **)(local_b8 + -2));
        }
      }
      else {
        (**(code **)(*(long *)pAStack_a0 + 8))();
      }
    }
  }
  return 0;
}

Assistant:

int Proposal::load_param(const ParamDict& pd)
{
    feat_stride = pd.get(0, 16);
    base_size = pd.get(1, 16);
    pre_nms_topN = pd.get(2, 6000);
    after_nms_topN = pd.get(3, 300);
    nms_thresh = pd.get(4, 0.7f);
    min_size = pd.get(5, 16);

//     Mat ratio;
//     Mat scale;

    anchors = generate_anchors(base_size, ratios, scales);

    return 0;
}